

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Reshape_x86::forward
          (Reshape_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  undefined4 *puVar2;
  Mat *src;
  Mat *dst;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  size_t sVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  bool bVar24;
  undefined8 uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  undefined8 extraout_RDX;
  ulong uVar31;
  undefined4 *puVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  undefined8 *puVar39;
  long lVar40;
  long lVar41;
  undefined8 *puVar42;
  int iVar43;
  long lVar44;
  byte bVar45;
  uint uVar46;
  undefined4 *puVar47;
  long lVar48;
  size_t sVar49;
  int outh;
  int outw;
  int outc;
  Option *local_120;
  int outd;
  undefined8 local_110;
  int local_108;
  undefined4 uStack_104;
  ulong local_100;
  int local_f4;
  ulong local_f0;
  Mat local_e8;
  Mat *local_a0;
  uint local_98;
  uint local_94;
  Mat *local_90;
  ulong local_88;
  long local_80;
  Option opt_flatten;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  dst = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  outw = (this->super_Reshape).w;
  outh = (this->super_Reshape).h;
  outd = (this->super_Reshape).d;
  outc = (this->super_Reshape).c;
  if (((this->super_Reshape).shape_expr._M_string_length != 0) &&
     (iVar26 = Reshape::eval_shape_expr(&this->super_Reshape,bottom_blobs,&outw,&outh,&outd,&outc),
     iVar26 != 0)) {
    return -1;
  }
  iVar26 = (this->super_Reshape).ndim;
  if (iVar26 == 1) {
    flatten(src,dst,opt);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      return 0;
    }
    return -100;
  }
  uVar28 = src->dims;
  uVar46 = src->elempack;
  local_f0 = (ulong)(int)uVar46;
  local_100 = src->elemsize;
  uVar23._0_4_ = src->dims;
  uVar23._4_4_ = src->w;
  iVar34 = src->h;
  uVar25._0_4_ = src->h;
  uVar25._4_4_ = src->d;
  iVar36 = src->c;
  iVar30 = iVar34 * src->d * src->w * uVar46 * iVar36;
  iVar43 = -1;
  if (iVar26 == 2) {
    local_110 = CONCAT44(local_110._4_4_,iVar30);
    if (outw == 0) {
      uVar27 = 1;
      if (uVar28 == 1) {
        uVar27 = uVar46;
      }
      outw = uVar27 * src->w;
    }
    if (outh == 0) {
      uVar27 = 1;
      if (uVar28 == 2) {
        uVar27 = uVar46;
      }
      outh = uVar27 * iVar34;
    }
    if (outw == -1) {
      outw = iVar30 / outh;
    }
    if (outh == -1) {
      outh = iVar30 / outw;
    }
    bVar45 = (outh & 3U) == 0 & opt->use_packing_layout;
    sVar49 = local_100 / local_f0 << bVar45 * '\x02';
    local_120 = opt;
    if (((uVar28 == 2) && (iVar34 * uVar46 == outh)) &&
       (uVar46 == (uint)bVar45 + (uint)bVar45 * 2 + 1)) {
      if (dst != src) {
        piVar3 = src->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = dst->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = dst->data;
            pAVar5 = dst->allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,local_100 % local_f0);
            }
          }
        }
        dst->cstep = 0;
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        *(undefined8 *)((long)&dst->refcount + 4) = 0;
        *(undefined8 *)((long)&dst->elemsize + 4) = 0;
        dst->dims = 0;
        dst->w = 0;
        dst->h = 0;
        dst->d = 0;
        dst->c = 0;
        piVar3 = src->refcount;
        dst->data = src->data;
        dst->refcount = piVar3;
        dst->elemsize = src->elemsize;
        dst->elempack = src->elempack;
        dst->allocator = src->allocator;
        iVar26 = src->w;
        iVar34 = src->h;
        iVar36 = src->d;
        dst->dims = src->dims;
        dst->w = iVar26;
        dst->h = iVar34;
        dst->d = iVar36;
        dst->c = src->c;
        dst->cstep = src->cstep;
        return 0;
      }
      return 0;
    }
    if (bVar45 == 0) {
      flatten(src,dst,opt);
      if (dst->data == (void *)0x0) {
        return -100;
      }
      if ((long)dst->c * dst->cstep != 0) {
        dst->dims = 2;
        dst->w = outw;
        dst->h = outh;
        dst->cstep = (long)outh * (long)outw;
        dst->elemsize = sVar49;
        dst->elempack = 1;
        return 0;
      }
      return -100;
    }
    local_e8.data = src->data;
    local_e8.refcount = src->refcount;
    local_e8.allocator = src->allocator;
    local_e8.cstep = src->cstep;
    if (local_e8.refcount != (int *)0x0) {
      LOCK();
      *local_e8.refcount = *local_e8.refcount + 1;
      UNLOCK();
    }
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.vulkan_device_index = opt->vulkan_device_index;
    opt_flatten.use_reserved_1 = opt->use_reserved_1;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_2 = opt->use_reserved_2;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
    opt_flatten.use_int8_uniform = opt->use_int8_uniform;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    local_e8.elemsize = local_100;
    local_e8.elempack = uVar46;
    local_e8._40_8_ = uVar23;
    local_e8._48_8_ = uVar25;
    local_e8.c = iVar36;
    flatten(src,&local_e8,&opt_flatten);
    iVar30 = (int)local_110;
    if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) {
      _local_108 = CONCAT44(uStack_104,0xffffff9c);
      uVar31 = 0;
    }
    else {
      iVar26 = outh + 3;
      if (-1 < outh) {
        iVar26 = outh;
      }
      Mat::create(dst,outw,iVar26 >> 2,sVar49,4,local_120->blob_allocator);
      iVar30 = (int)local_110;
      if ((dst->data == (void *)0x0) || ((long)dst->c * dst->cstep == 0)) {
        _local_108 = CONCAT44(uStack_104,0xffffff9c);
        uVar31 = 0;
      }
      else {
        uVar31 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
        if (dst->h < 1) {
          _local_108 = CONCAT44(uStack_104,0xffffffff);
        }
        else {
          lVar29 = (long)outw;
          local_f4 = outw * 4;
          local_94 = outw & 0xfffffffc;
          local_80 = lVar29 * 0x10;
          lVar40 = lVar29 * 8;
          lVar44 = lVar29 * 0xc;
          iVar26 = 0;
          lVar38 = 0;
          lVar41 = lVar29 * 4;
          do {
            lVar48 = lVar41;
            iVar34 = dst->w;
            pvVar4 = dst->data;
            sVar49 = dst->elemsize;
            puVar47 = (undefined4 *)(lVar38 * iVar34 * sVar49 + (long)pvVar4);
            if (outw < 4) {
              lVar41 = (long)(local_f4 * (int)lVar38) * 4;
              lVar1 = (lVar38 * 4 + 1) * lVar29 * 4;
              lVar37 = (lVar38 * 4 + 2) * lVar29 * 4;
              lVar35 = (lVar38 * 4 + 3) * lVar29 * 4;
              uVar27 = 0;
            }
            else {
              iVar36 = 3;
              lVar35 = 0;
              do {
                puVar32 = puVar47;
                puVar2 = (undefined4 *)((long)local_e8.data + lVar35 + (long)iVar26 * 4);
                uVar8 = puVar2[1];
                uVar9 = puVar2[2];
                uVar10 = puVar2[3];
                puVar47 = (undefined4 *)((long)local_e8.data + lVar35 + lVar48);
                uVar11 = *puVar47;
                uVar12 = puVar47[1];
                uVar13 = puVar47[2];
                uVar14 = puVar47[3];
                puVar47 = (undefined4 *)((long)local_e8.data + lVar35 + lVar40);
                uVar15 = *puVar47;
                uVar16 = puVar47[1];
                uVar17 = puVar47[2];
                uVar18 = puVar47[3];
                puVar47 = (undefined4 *)((long)local_e8.data + lVar35 + lVar44);
                uVar19 = *puVar47;
                uVar20 = puVar47[1];
                uVar21 = puVar47[2];
                uVar22 = puVar47[3];
                puVar47 = (undefined4 *)
                          ((long)pvVar4 + lVar35 * 4 + sVar49 * lVar38 * (long)iVar34 + 0x40);
                puVar47[-0x10] = *puVar2;
                puVar47[-0xf] = uVar11;
                puVar47[-0xe] = uVar15;
                puVar47[-0xd] = uVar19;
                puVar47[-0xc] = uVar8;
                puVar47[-0xb] = uVar12;
                puVar47[-10] = uVar16;
                puVar47[-9] = uVar20;
                puVar47[-8] = uVar9;
                puVar47[-7] = uVar13;
                puVar47[-6] = uVar17;
                puVar47[-5] = uVar21;
                puVar47[-4] = uVar10;
                puVar47[-3] = uVar14;
                puVar47[-2] = uVar18;
                puVar47[-1] = uVar22;
                lVar35 = lVar35 + 0x10;
                iVar36 = iVar36 + 4;
              } while (iVar36 < outw);
              puVar47 = puVar32 + 0x10;
              lVar41 = lVar35 + (long)iVar26 * 4;
              lVar1 = lVar35 + lVar48;
              lVar37 = lVar35 + lVar40;
              lVar35 = lVar35 + lVar44;
              uVar27 = local_94;
            }
            if ((int)uVar27 < outw) {
              lVar33 = 0;
              do {
                *puVar47 = *(undefined4 *)((long)local_e8.data + lVar33 * 4 + lVar41);
                puVar47[1] = *(undefined4 *)((long)local_e8.data + lVar33 * 4 + lVar1);
                puVar47[2] = *(undefined4 *)((long)local_e8.data + lVar33 * 4 + lVar37);
                puVar47[3] = *(undefined4 *)((long)local_e8.data + lVar33 * 4 + lVar35);
                puVar47 = puVar47 + 4;
                lVar33 = lVar33 + 1;
              } while (outw - uVar27 != (int)lVar33);
            }
            lVar38 = lVar38 + 1;
            iVar26 = iVar26 + local_f4;
            lVar40 = lVar40 + local_80;
            lVar44 = lVar44 + local_80;
            lVar41 = lVar48 + local_80;
          } while (lVar38 < dst->h);
          uStack_104 = (undefined4)((ulong)lVar48 >> 0x20);
          _local_108 = CONCAT44(uStack_104,0xffffffff);
          uVar31 = CONCAT71((int7)((ulong)local_80 >> 8),1);
          local_a0 = dst;
          local_98 = uVar46;
          local_90 = src;
          local_88 = (ulong)uVar28;
        }
      }
    }
    opt = local_120;
    if (local_e8.refcount != (int *)0x0) {
      LOCK();
      *local_e8.refcount = *local_e8.refcount + -1;
      UNLOCK();
      if (*local_e8.refcount == 0) {
        if (local_e8.allocator == (Allocator *)0x0) {
          if (local_e8.data != (void *)0x0) {
            local_120 = (Option *)CONCAT44(local_120._4_4_,(int)uVar31);
            free(local_e8.data);
            uVar31 = (ulong)local_120 & 0xffffffff;
            iVar30 = (int)local_110;
          }
        }
        else {
          local_120 = (Option *)CONCAT44(local_120._4_4_,(int)uVar31);
          (*(local_e8.allocator)->_vptr_Allocator[3])();
          uVar31 = (ulong)local_120 & 0xffffffff;
          iVar30 = (int)local_110;
        }
      }
    }
    if ((char)uVar31 == '\0') {
      return local_108;
    }
    iVar26 = (this->super_Reshape).ndim;
    iVar43 = local_108;
  }
  if (1 < iVar26 - 3U) {
    return 0;
  }
  _local_108 = CONCAT44(uStack_104,iVar43);
  if (iVar26 == 3) {
    if (outw == 0) {
      uVar27 = 1;
      if (uVar28 == 1) {
        uVar27 = uVar46;
      }
      outw = uVar27 * src->w;
    }
    if (outh == 0) {
      uVar27 = 1;
      if (uVar28 == 2) {
        uVar27 = uVar46;
      }
      outh = uVar27 * src->h;
    }
    if (outc == 0) {
      uVar27 = 1;
      if (uVar28 == 3) {
        uVar27 = uVar46;
      }
      outc = uVar27 * src->c;
    }
    uVar31 = (ulong)(uint)outc;
    if (outw == -1) {
      outw = (int)((long)((ulong)(uint)((int)((long)iVar30 / (long)outc) >> 0x1f) << 0x20 |
                         (long)iVar30 / (long)outc & 0xffffffffU) / (long)outh);
    }
    if (outh == -1) {
      outh = (int)((long)((ulong)(uint)((int)((long)iVar30 / (long)outc) >> 0x1f) << 0x20 |
                         (long)iVar30 / (long)outc & 0xffffffffU) / (long)outw);
    }
    if (outc == -1) {
      uVar31 = (long)((ulong)(uint)((int)((long)iVar30 / (long)outh) >> 0x1f) << 0x20 |
                     (long)iVar30 / (long)outh & 0xffffffffU) / (long)outw;
      outc = (int)uVar31;
      uVar31 = uVar31 & 0xffffffff;
    }
    outd = 1;
    local_120 = (Option *)CONCAT44(local_120._4_4_,1);
  }
  else {
    if (outw == 0) {
      uVar27 = 1;
      if (uVar28 == 1) {
        uVar27 = uVar46;
      }
      outw = uVar27 * src->w;
    }
    if (outh == 0) {
      uVar27 = 1;
      if (uVar28 == 2) {
        uVar27 = uVar46;
      }
      outh = uVar27 * src->h;
    }
    if (outd == 0) {
      outd = src->d;
    }
    if (outc == 0) {
      uVar27 = 1;
      if (uVar28 - 3 < 2) {
        uVar27 = uVar46;
      }
      outc = uVar27 * src->c;
    }
    uVar31 = (ulong)(uint)outc;
    if (outw == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)iVar30 / (long)outc) >> 0x1f) << 0x20 |
                    (long)iVar30 / (long)outc & 0xffffffffU) / (long)outd;
      outw = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                  (long)outh);
    }
    if (outh == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)iVar30 / (long)outc) >> 0x1f) << 0x20 |
                    (long)iVar30 / (long)outc & 0xffffffffU) / (long)outd;
      outh = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                  (long)outw);
    }
    if (outd == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)iVar30 / (long)outc) >> 0x1f) << 0x20 |
                    (long)iVar30 / (long)outc & 0xffffffffU) / (long)outh;
      outd = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                  (long)outw);
    }
    local_120 = (Option *)CONCAT44(local_120._4_4_,outd);
    if (outc == -1) {
      uVar31 = (long)((ulong)(uint)((int)((long)iVar30 / (long)outd) >> 0x1f) << 0x20 |
                     (long)iVar30 / (long)outd & 0xffffffffU) / (long)outh;
      uVar31 = (long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | uVar31 & 0xffffffff) / (long)outw
      ;
      outc = (int)uVar31;
      uVar31 = uVar31 & 0xffffffff;
    }
  }
  bVar45 = (uVar31 & 3) == 0 & opt->use_packing_layout;
  uVar27 = (uint)bVar45 + (uint)bVar45 * 2 + 1;
  local_110 = (ulong)uVar27;
  sVar49 = local_100 / local_f0 << bVar45 * '\x02';
  iVar34 = src->c;
  if (((uVar28 - 3 < 2) && (iVar34 * uVar46 == (int)uVar31)) && (uVar46 == uVar27)) {
    if (dst != src) {
      piVar3 = src->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = dst->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = dst->data;
          pAVar5 = dst->allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,local_100 % local_f0);
          }
        }
      }
      dst->cstep = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      *(undefined8 *)((long)&dst->refcount + 4) = 0;
      *(undefined8 *)((long)&dst->elemsize + 4) = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->h = 0;
      dst->d = 0;
      dst->c = 0;
      piVar3 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar3;
      dst->elemsize = src->elemsize;
      dst->elempack = src->elempack;
      dst->allocator = src->allocator;
      iVar26 = src->w;
      iVar34 = src->h;
      iVar36 = src->d;
      dst->dims = src->dims;
      dst->w = iVar26;
      dst->h = iVar34;
      dst->d = iVar36;
      dst->c = src->c;
      dst->cstep = src->cstep;
      iVar26 = (this->super_Reshape).ndim;
      local_120._0_4_ = outd;
    }
    dst->dims = iVar26;
    dst->w = outw;
    dst->h = outh;
    dst->d = (int)local_120;
    return 0;
  }
  local_e8.data = src->data;
  local_e8.refcount = src->refcount;
  local_e8.elemsize = src->elemsize;
  local_e8.elempack = src->elempack;
  local_e8.allocator = src->allocator;
  local_e8.dims = src->dims;
  local_e8.w = src->w;
  local_e8.h = src->h;
  local_e8.d = src->d;
  local_e8.cstep = src->cstep;
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + 1;
    UNLOCK();
  }
  opt_flatten.lightmode = opt->lightmode;
  opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
  opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
  opt_flatten.use_reserved_0 = opt->use_reserved_0;
  opt_flatten.num_threads = opt->num_threads;
  opt_flatten.workspace_allocator = opt->workspace_allocator;
  opt_flatten.openmp_blocktime = opt->openmp_blocktime;
  opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
  opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_flatten.use_int8_inference = opt->use_int8_inference;
  opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
  opt_flatten.use_bf16_storage = opt->use_bf16_storage;
  opt_flatten.use_fp16_packed = opt->use_fp16_packed;
  opt_flatten.use_fp16_storage = opt->use_fp16_storage;
  opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_flatten.use_int8_packed = opt->use_int8_packed;
  opt_flatten.use_int8_storage = opt->use_int8_storage;
  opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_flatten.use_packing_layout = opt->use_packing_layout;
  opt_flatten.vulkan_device_index = opt->vulkan_device_index;
  opt_flatten.use_reserved_1 = opt->use_reserved_1;
  opt_flatten.use_image_storage = opt->use_image_storage;
  opt_flatten.use_tensor_storage = opt->use_tensor_storage;
  opt_flatten.use_reserved_2 = opt->use_reserved_2;
  opt_flatten.flush_denormals = opt->flush_denormals;
  opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
  opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
  opt_flatten.use_int8_uniform = opt->use_int8_uniform;
  opt_flatten.use_reserved_9 = opt->use_reserved_9;
  opt_flatten.use_reserved_10 = opt->use_reserved_10;
  opt_flatten.use_reserved_11 = opt->use_reserved_11;
  opt_flatten.blob_allocator = opt->workspace_allocator;
  local_e8.c = iVar34;
  flatten(src,&local_e8,&opt_flatten);
  if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
    iVar26 = (int)local_110;
    if ((this->super_Reshape).ndim == 3) {
      Mat::create(dst,outw,outh,outc / iVar26,sVar49,iVar26,opt->blob_allocator);
    }
    else {
      Mat::create(dst,outw,outh,outd,outc / iVar26,sVar49,iVar26,opt->blob_allocator);
    }
    if ((dst->data != (void *)0x0) && (iVar26 = dst->c, dst->cstep * (long)iVar26 != 0)) {
      uVar28 = dst->h * dst->w * dst->d;
      bVar24 = true;
      iVar34 = local_108;
      if (bVar45 == 0) {
        if (0 < iVar26) {
          lVar40 = 0;
          do {
            puVar39 = (undefined8 *)(dst->cstep * lVar40 * dst->elemsize + (long)dst->data);
            puVar42 = (undefined8 *)(lVar40 * (int)uVar28 * 4 + (long)local_e8.data);
            if ((int)uVar28 < 4) {
              uVar46 = 0;
            }
            else {
              iVar26 = 3;
              do {
                uVar23 = puVar42[1];
                *puVar39 = *puVar42;
                puVar39[1] = uVar23;
                puVar42 = puVar42 + 2;
                puVar39 = puVar39 + 2;
                iVar26 = iVar26 + 4;
                uVar46 = uVar28 & 0xfffffffc;
              } while (iVar26 < (int)uVar28);
            }
            if (uVar28 - uVar46 != 0 && (int)uVar46 <= (int)uVar28) {
              lVar44 = 0;
              do {
                *(undefined4 *)((long)puVar39 + lVar44 * 4) =
                     *(undefined4 *)((long)puVar42 + lVar44 * 4);
                lVar44 = lVar44 + 1;
              } while (uVar28 - uVar46 != (int)lVar44);
            }
            lVar40 = lVar40 + 1;
          } while (lVar40 < dst->c);
        }
      }
      else if (0 < iVar26) {
        iVar26 = uVar28 * 4;
        local_100 = CONCAT44(local_100._4_4_,iVar26);
        local_110 = CONCAT44(local_110._4_4_,uVar28) & 0xfffffffffffffffc;
        local_120 = (Option *)(long)(int)uVar28;
        lVar40 = (long)local_120 * 4;
        lVar41 = (long)local_120 * 0xc;
        local_f0 = (long)local_120 * 0x10;
        lVar44 = (long)local_120 * 8;
        iVar36 = 0;
        lVar29 = 0;
        do {
          sVar49 = dst->cstep;
          pvVar4 = dst->data;
          sVar6 = dst->elemsize;
          puVar47 = (undefined4 *)(sVar49 * lVar29 * sVar6 + (long)pvVar4);
          if ((int)uVar28 < 4) {
            lVar38 = (lVar29 * 4 + 3) * (long)local_120 * 4;
            lVar48 = (lVar29 * 4 + 2) * (long)local_120 * 4;
            lVar1 = (lVar29 * 4 + 1) * (long)local_120 * 4;
            lVar37 = (long)(iVar26 * (int)lVar29) * 4;
            iVar43 = 0;
          }
          else {
            iVar43 = 3;
            lVar37 = 0;
            do {
              puVar32 = puVar47;
              puVar2 = (undefined4 *)((long)local_e8.data + lVar37 + (long)iVar36 * 4);
              uVar8 = puVar2[1];
              uVar9 = puVar2[2];
              uVar10 = puVar2[3];
              puVar47 = (undefined4 *)((long)local_e8.data + lVar37 + lVar40);
              uVar11 = *puVar47;
              uVar12 = puVar47[1];
              uVar13 = puVar47[2];
              uVar14 = puVar47[3];
              puVar47 = (undefined4 *)((long)local_e8.data + lVar37 + lVar44);
              uVar15 = *puVar47;
              uVar16 = puVar47[1];
              uVar17 = puVar47[2];
              uVar18 = puVar47[3];
              puVar47 = (undefined4 *)((long)local_e8.data + lVar37 + lVar41);
              uVar19 = *puVar47;
              uVar20 = puVar47[1];
              uVar21 = puVar47[2];
              uVar22 = puVar47[3];
              puVar47 = (undefined4 *)((long)pvVar4 + lVar37 * 4 + sVar49 * sVar6 * lVar29 + 0x40);
              puVar47[-0x10] = *puVar2;
              puVar47[-0xf] = uVar11;
              puVar47[-0xe] = uVar15;
              puVar47[-0xd] = uVar19;
              puVar47[-0xc] = uVar8;
              puVar47[-0xb] = uVar12;
              puVar47[-10] = uVar16;
              puVar47[-9] = uVar20;
              puVar47[-8] = uVar9;
              puVar47[-7] = uVar13;
              puVar47[-6] = uVar17;
              puVar47[-5] = uVar21;
              puVar47[-4] = uVar10;
              puVar47[-3] = uVar14;
              puVar47[-2] = uVar18;
              puVar47[-1] = uVar22;
              iVar43 = iVar43 + 4;
              lVar37 = lVar37 + 0x10;
            } while (iVar43 < (int)uVar28);
            puVar47 = puVar32 + 0x10;
            lVar38 = lVar37 + lVar41;
            lVar48 = lVar37 + lVar44;
            lVar1 = lVar37 + lVar40;
            lVar37 = lVar37 + (long)iVar36 * 4;
            iVar43 = (int)local_110;
          }
          if (uVar28 - iVar43 != 0 && iVar43 <= (int)uVar28) {
            lVar35 = 0;
            do {
              *puVar47 = *(undefined4 *)((long)local_e8.data + lVar35 * 4 + lVar37);
              puVar47[1] = *(undefined4 *)((long)local_e8.data + lVar35 * 4 + lVar1);
              puVar47[2] = *(undefined4 *)((long)local_e8.data + lVar35 * 4 + lVar48);
              puVar47[3] = *(undefined4 *)((long)local_e8.data + lVar35 * 4 + lVar38);
              puVar47 = puVar47 + 4;
              lVar35 = lVar35 + 1;
            } while (uVar28 - iVar43 != (int)lVar35);
          }
          lVar29 = lVar29 + 1;
          lVar41 = lVar41 + local_f0;
          lVar44 = lVar44 + local_f0;
          lVar40 = lVar40 + local_f0;
          iVar36 = iVar36 + iVar26;
        } while (lVar29 < dst->c);
        bVar24 = true;
        local_a0 = dst;
      }
      goto LAB_0032dfce;
    }
  }
  bVar24 = false;
  iVar34 = -100;
LAB_0032dfce:
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + -1;
    UNLOCK();
    if (*local_e8.refcount == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (bVar24) {
    return 0;
  }
  return iVar34;
}

Assistant:

int Reshape_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    Mat& top_blob = top_blobs[0];

    // resolve out shape
    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (!shape_expr.empty())
    {
        int er = eval_shape_expr(bottom_blobs, outw, outh, outd, outc);
        if (er != 0)
            return -1;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    const int dims = bottom_blob.dims;
    const int elempack = bottom_blob.elempack;
    const size_t elemsize = bottom_blob.elemsize;

    const int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        if (outw == 0)
            outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (outh == 0)
            outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == outh && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.cstep = (size_t)outw * outh;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + outw * (i * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + outw * (i * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + outw * (i * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + outw * (i * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + outw * (i * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + outw * (i * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + outw * (i * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + outw * (i * 16 + 15);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 15 < outw; j += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        if (ndim == 3)
        {
            if (outw == 0)
                outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (outh == 0)
                outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (outc == 0)
                outc = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (outw == -1)
                outw = total / outc / outh;
            if (outh == -1)
                outh = total / outc / outw;
            if (outc == -1)
                outc = total / outh / outw;

            outd = 1;
        }
        else // if (ndim == 4)
        {
            if (outw == 0)
                outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (outh == 0)
                outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (outd == 0)
                outd = bottom_blob.d;
            if (outc == 0)
                outc = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (outw == -1)
                outw = total / outc / outd / outh;
            if (outh == -1)
                outh = total / outc / outd / outw;
            if (outd == -1)
                outd = total / outc / outh / outw;
            if (outc == -1)
                outc = total / outd / outh / outw;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if ((dims == 3 || dims == 4) && bottom_blob.c * elempack == outc && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.dims = ndim;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(outw, outh, outd, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + size * (q * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + size * (q * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + size * (q * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + size * (q * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + size * (q * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + size * (q * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + size * (q * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + size * (q * 16 + 15);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}